

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfd::capi::CfdCapiManager::SetLastError
          (CfdCapiManager *this,void *handle,int error_code,char *message)

{
  size_t sVar1;
  char *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  string err_str;
  CfdCapiHandleData *data;
  allocator local_49;
  string local_48 [32];
  long local_28;
  char *local_20;
  undefined4 local_14;
  
  if (in_RSI != 0) {
    local_28 = in_RSI;
    local_20 = in_RCX;
    local_14 = in_EDX;
    memset((void *)(in_RSI + 0x15),0,0x100);
    if (local_20 != (char *)0x0) {
      sVar1 = strnlen(local_20,0x100);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,local_20,sVar1,&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      std::__cxx11::string::copy((char *)local_48,local_28 + 0x15,0xff);
      *(undefined1 *)(local_28 + 0x114) = 0;
      std::__cxx11::string::~string(local_48);
    }
    *(undefined4 *)(local_28 + 0x10) = local_14;
  }
  return;
}

Assistant:

void CfdCapiManager::SetLastError(
    void* handle, int error_code, const char* message) {
  if (handle != nullptr) {
    CfdCapiHandleData* data = static_cast<CfdCapiHandleData*>(handle);
    memset(data->error_message, 0, sizeof(data->error_message));
    if (message != nullptr) {
      std::string err_str(
          message, strnlen(message, sizeof(data->error_message)));
      err_str.copy(data->error_message, sizeof(data->error_message) - 1);
      data->error_message[sizeof(data->error_message) - 1] = '\0';
    }
    data->error_code = error_code;
  }
}